

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_split.cc
# Opt level: O3

string_view __thiscall absl::ByChar::Find(ByChar *this,string_view text,size_t pos)

{
  void *pvVar1;
  ulong uVar2;
  ulong uVar3;
  char *pcVar4;
  ulong uVar5;
  string_view sVar6;
  
  pcVar4 = text._M_str;
  uVar5 = text._M_len;
  if (pos <= uVar5 && uVar5 - pos != 0) {
    pvVar1 = memchr(pcVar4 + pos,(int)this->c_,uVar5 - pos);
    uVar2 = (long)pvVar1 - (long)pcVar4;
    if (uVar2 != 0xffffffffffffffff && pvVar1 != (void *)0x0) {
      if (uVar5 < uVar2) {
        std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                   uVar2,uVar5);
      }
      uVar3 = (ulong)(uVar2 != uVar5);
      goto LAB_00260bb4;
    }
  }
  uVar3 = 0;
  uVar2 = uVar5;
LAB_00260bb4:
  sVar6._M_str = pcVar4 + uVar2;
  sVar6._M_len = uVar3;
  return sVar6;
}

Assistant:

absl::string_view ByChar::Find(absl::string_view text, size_t pos) const {
  size_t found_pos = text.find(c_, pos);
  if (found_pos == absl::string_view::npos)
    return absl::string_view(text.data() + text.size(), 0);
  return text.substr(found_pos, 1);
}